

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnArrayType
          (BinaryReaderIR *this,Index index,TypeMut type_mut)

{
  _Head_base<0UL,_wabt::TypeEntry_*,_false> _Var1;
  char *pcVar2;
  TypeModuleField *local_50;
  _Head_base<0UL,_wabt::TypeModuleField_*,_false> local_48;
  Location local_40;
  
  GetLocation(&local_40,this);
  MakeUnique<wabt::TypeModuleField,wabt::Location>((wabt *)&local_50,&local_40);
  MakeUnique<wabt::ArrayType>();
  pcVar2 = local_40.filename.data_;
  *(Enum *)((long)&(((TypeEntry *)((long)local_40.filename.data_ + 0x50))->loc).field_1.field_0 + 8)
       = type_mut.type.enum_.enum_;
  *(byte *)((long)(((TypeEntry *)((long)local_40.filename.data_ + 0x50))->loc).field_1.field2 + 0xc)
       = type_mut.mutable_ & 1;
  local_40.filename.data_ = (char *)0x0;
  _Var1._M_head_impl =
       (local_50->type)._M_t.
       super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
       super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
       super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl;
  (local_50->type)._M_t.
  super___uniq_ptr_impl<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>._M_t.
  super__Tuple_impl<0UL,_wabt::TypeEntry_*,_std::default_delete<wabt::TypeEntry>_>.
  super__Head_base<0UL,_wabt::TypeEntry_*,_false>._M_head_impl = (TypeEntry *)pcVar2;
  local_48._M_head_impl = local_50;
  if (_Var1._M_head_impl != (TypeEntry *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_TypeEntry + 8))();
    local_48._M_head_impl = local_50;
  }
  local_50 = (TypeModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)&local_48);
  if (local_48._M_head_impl != (TypeModuleField *)0x0) {
    (*((local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)4>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_48._M_head_impl = (TypeModuleField *)0x0;
  if ((long *)local_40.filename.data_ != (long *)0x0) {
    (**(code **)(*(long *)local_40.filename.data_ + 8))();
  }
  if (local_50 != (TypeModuleField *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnArrayType(Index index, TypeMut type_mut) {
  auto field = MakeUnique<TypeModuleField>(GetLocation());
  auto array_type = MakeUnique<ArrayType>();
  array_type->field.type = type_mut.type;
  array_type->field.mutable_ = type_mut.mutable_;
  field->type = std::move(array_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}